

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ArrayJoinPromiseNode<int>::getNoError
          (ArrayJoinPromiseNode<int> *this,ExceptionOrValue *output)

{
  long lVar1;
  ExceptionOr<int> *pEVar2;
  long lVar3;
  Array<int> result;
  Array<int> local_208;
  ArrayBuilder<int> local_1e8;
  ExceptionOr<kj::Array<int>_> local_1c8;
  
  local_1c8.value.ptr.field_1.value.ptr =
       HeapArrayDisposer::allocateUninitialized<int>((this->resultParts).size_);
  local_1e8.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  pEVar2 = (this->resultParts).ptr;
  lVar1 = 0;
  for (lVar3 = (this->resultParts).size_ * 0x1a0; lVar3 != 0; lVar3 = lVar3 + -0x1a0) {
    *(anon_union_4_1_a8c68091_for_NullableValue<int>_2 *)
     ((long)local_1c8.value.ptr.field_1.value.ptr + lVar1) = (pEVar2->value).ptr.field_1;
    pEVar2 = pEVar2 + 1;
    lVar1 = lVar1 + 4;
  }
  local_1c8.value.ptr.field_1.value.size_ = lVar1 >> 2;
  local_208.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  local_1e8.endPtr = (int *)0x0;
  local_1e8.ptr = (int *)0x0;
  local_1e8.pos = (RemoveConst<int> *)0x0;
  local_1c8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1c8.value.ptr.isSet = true;
  local_1c8.value.ptr.field_1.value.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  local_208.ptr = (int *)0x0;
  local_208.size_ = 0;
  ExceptionOr<kj::Array<int>_>::operator=((ExceptionOr<kj::Array<int>_> *)output,&local_1c8);
  ExceptionOr<kj::Array<int>_>::~ExceptionOr(&local_1c8);
  Array<int>::~Array(&local_208);
  ArrayBuilder<int>::dispose(&local_1e8);
  return;
}

Assistant:

void getNoError(ExceptionOrValue& output) noexcept override {
    auto builder = heapArrayBuilder<T>(resultParts.size());
    for (auto& part: resultParts) {
      KJ_IASSERT(part.value != kj::none,
                 "Bug in KJ promise framework:  Promise result had neither value no exception.");
      builder.add(kj::mv(*_::readMaybe(part.value)));
    }
    output.as<Array<T>>() = builder.finish();
  }